

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprSimplifiedAndOr(Expr *pExpr)

{
  Expr *in_RDI;
  Expr *pLeft;
  Expr *pRight;
  Expr *local_28;
  Expr *local_20;
  Expr *in_stack_fffffffffffffff0;
  Expr *local_8;
  
  local_8 = in_RDI;
  if ((in_RDI->op == ',') || (in_RDI->op == '+')) {
    local_28 = sqlite3ExprSimplifiedAndOr(in_stack_fffffffffffffff0);
    local_20 = sqlite3ExprSimplifiedAndOr(local_28);
    if (((local_20->flags & 0x10000001) == 0x10000000) ||
       ((local_28->flags & 0x20000001) == 0x20000000)) {
      if (in_RDI->op == ',') {
        local_20 = local_28;
      }
      local_8 = local_20;
    }
    else if (((local_28->flags & 0x10000001) == 0x10000000) ||
            ((local_20->flags & 0x20000001) == 0x20000000)) {
      if (in_RDI->op == ',') {
        local_28 = local_20;
      }
      local_8 = local_28;
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSimplifiedAndOr(Expr *pExpr){
  assert( pExpr!=0 );
  if( pExpr->op==TK_AND || pExpr->op==TK_OR ){
    Expr *pRight = sqlite3ExprSimplifiedAndOr(pExpr->pRight);
    Expr *pLeft = sqlite3ExprSimplifiedAndOr(pExpr->pLeft);
    if( ExprAlwaysTrue(pLeft) || ExprAlwaysFalse(pRight) ){
      pExpr = pExpr->op==TK_AND ? pRight : pLeft;
    }else if( ExprAlwaysTrue(pRight) || ExprAlwaysFalse(pLeft) ){
      pExpr = pExpr->op==TK_AND ? pLeft : pRight;
    }
  }
  return pExpr;
}